

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O3

void __thiscall RleTaskScheduler::run(RleTaskScheduler *this,uint i)

{
  bool bVar1;
  void *__s;
  pthread_t __target_thread;
  uint uVar2;
  int iVar3;
  SW_FT_Stroker stroker;
  VTask task;
  ostringstream nameStream;
  SW_FT_Stroker local_260;
  shared_ptr<VRleTask> local_258;
  undefined1 local_248 [64];
  undefined1 local_208;
  undefined8 local_1e8;
  void *local_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_208 = 0;
  local_1e8 = 100;
  __s = operator_new__(0x640);
  memset(__s,0,0x640);
  local_1d8 = 100;
  local_1e0 = __s;
  local_1d0 = (undefined8 *)operator_new__(100);
  *local_1d0 = 0;
  local_1d0[1] = 0;
  local_1d0[2] = 0;
  local_1d0[3] = 0;
  local_1d0[4] = 0;
  local_1d0[5] = 0;
  local_1d0[6] = 0;
  local_1d0[7] = 0;
  local_1d0[8] = 0;
  local_1d0[9] = 0;
  local_1d0[10] = 0;
  local_1d0[0xb] = 0;
  *(undefined4 *)(local_1d0 + 0xc) = 0;
  local_1c8 = 10;
  local_1c0 = (undefined8 *)operator_new__(0x14);
  *local_1c0 = 0;
  local_1c0[1] = 0;
  *(undefined4 *)(local_1c0 + 2) = 0;
  local_1b8 = 10;
  local_1b0 = (undefined8 *)operator_new__(10);
  *local_1b0 = 0;
  *(undefined2 *)(local_1b0 + 1) = 0;
  SW_FT_Stroker_New(&local_260);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"lottie-tsk-",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  __target_thread = pthread_self();
  std::__cxx11::stringbuf::str();
  pthread_setname_np(__target_thread,
                     (char *)local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
  if (local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_248) {
    operator_delete(local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_248._0_8_ + 1);
  }
  local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (VRleTask *)0x0;
  local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    uVar2 = this->_count;
    if ((uVar2 & 0x7fffffff) != 0) {
      iVar3 = 0;
      do {
        bVar1 = TaskQueue<std::shared_ptr<VRleTask>_>::try_pop
                          ((this->_q).
                           super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           (ulong)(i + iVar3) % (ulong)uVar2,&local_258);
        if (bVar1) goto LAB_00118d12;
        iVar3 = iVar3 + 1;
        uVar2 = this->_count;
      } while (iVar3 != uVar2 * 2);
    }
    bVar1 = TaskQueue<std::shared_ptr<VRleTask>_>::pop
                      ((this->_q).
                       super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i,&local_258);
    if (!bVar1) {
      SW_FT_Stroker_Done(local_260);
      if (local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      if (local_1b0 != (undefined8 *)0x0) {
        operator_delete__(local_1b0);
      }
      local_1b0 = (undefined8 *)0x0;
      if (local_1c0 != (undefined8 *)0x0) {
        operator_delete__(local_1c0);
      }
      local_1c0 = (undefined8 *)0x0;
      if (local_1d0 != (undefined8 *)0x0) {
        operator_delete__(local_1d0);
      }
      local_1d0 = (undefined8 *)0x0;
      if (local_1e0 != (void *)0x0) {
        operator_delete__(local_1e0);
      }
      return;
    }
LAB_00118d12:
    VRleTask::operator()
              (local_258.super___shared_ptr<VRleTask,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (FTOutline *)(local_248 + 0x10),&local_260);
  } while( true );
}

Assistant:

void run(unsigned i)
    {
        /*
         * initalize  per thread objects.
         */
        FTOutline     outlineRef;
        SW_FT_Stroker stroker;
        SW_FT_Stroker_New(&stroker);

        // Create Thread Name for Debugging (Linux)
#ifdef __linux__
        std::ostringstream nameStream;
        nameStream << "lottie-tsk-" << i;
        pthread_setname_np(pthread_self(), nameStream.str().c_str());
#endif

        // Task Loop
        VTask task;
        while (true) {
            bool success = false;

            for (unsigned n = 0; n != _count * 2; ++n) {
                if (_q[(i + n) % _count].try_pop(task)) {
                    success = true;
                    break;
                }
            }

            if (!success && !_q[i].pop(task)) break;

            (*task)(outlineRef, stroker);
        }

        // cleanup
        SW_FT_Stroker_Done(stroker);
    }